

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

sarimax_wrapper_object
sarimax_wrapper(sarimax_wrapper_object model,double *y,int N,int *order,int *seasonal,double *xreg,
               int r,int idrift,int mean,double *lambda,int biasadj,int method)

{
  double dVar1;
  int d_00;
  int q_00;
  int iVar2;
  double *bxcx;
  void *__dest;
  sarimax_wrapper_object psVar3;
  sarimax_object psVar4;
  bool bVar5;
  double dVar6;
  double local_98;
  double rsum;
  double *xreg2;
  double *origx;
  double *x;
  int rr;
  int drift;
  int ncoeff;
  int s;
  int Q;
  int D;
  int P;
  int q;
  int d;
  int p;
  int i;
  sarimax_wrapper_object obj;
  double *xreg_local;
  int *seasonal_local;
  int *order_local;
  int N_local;
  double *y_local;
  sarimax_wrapper_object model_local;
  
  bxcx = (double *)malloc((long)N << 3);
  __dest = malloc((long)N << 3);
  psVar3 = (sarimax_wrapper_object)malloc(0x38);
  memcpy(bxcx,y,(long)N << 3);
  memcpy(__dest,y,(long)N << 3);
  if (lambda != (double *)0x0) {
    boxcox_eval(y,N,*lambda,bxcx);
  }
  if (seasonal == (int *)0x0) {
    drift = 0;
    ncoeff = 0;
    s = 0;
    Q = 0;
  }
  if (model == (sarimax_wrapper_object)0x0) {
    iVar2 = *order;
    d_00 = order[1];
    q_00 = order[2];
    if (seasonal != (int *)0x0) {
      Q = *seasonal;
      s = seasonal[1];
      ncoeff = seasonal[2];
      drift = seasonal[3];
    }
    bVar5 = idrift == 1;
    if ((1 < d_00 + s) && (idrift == 1)) {
      bVar5 = false;
    }
    x._4_4_ = r;
    if (bVar5) {
      psVar3->idrift = 1;
      x._4_4_ = r + 1;
      rsum = (double)malloc((long)N * 8 * (long)x._4_4_);
      for (d = 0; d < N; d = d + 1) {
        *(double *)((long)rsum + (long)d * 8) = (double)(d + 1);
      }
      memcpy((void *)((long)rsum + (long)N * 8),xreg,(long)N * 8 * (long)r);
    }
    else {
      rsum = (double)malloc((long)N * 8 * (long)r);
      memcpy((void *)rsum,xreg,(long)N * 8 * (long)r);
    }
    psVar4 = sarimax_init(iVar2,d_00,q_00,Q,s,ncoeff,drift,x._4_4_,mean,N);
    psVar3->sarimax = psVar4;
    sarimax_exec(psVar3->sarimax,bxcx,(double *)rsum);
    psVar3->aic = psVar3->sarimax->aic;
    iVar2 = psVar3->sarimax->p + psVar3->sarimax->q + psVar3->sarimax->P + psVar3->sarimax->Q +
            psVar3->sarimax->M + 1;
    psVar3->aicc = (double)(iVar2 * 2) *
                   ((double)psVar3->sarimax->Nused / (double)((psVar3->sarimax->Nused - iVar2) + -1)
                   - 1.0) + psVar3->aic;
    dVar1 = psVar3->aic;
    dVar6 = log((double)psVar3->sarimax->Nused);
    psVar3->bic = (double)iVar2 * (dVar6 - 2.0) + dVar1;
    local_98 = 0.0;
    for (d = 0; d < psVar3->sarimax->Nused; d = d + 1) {
      local_98 = psVar3->sarimax->res[d] * psVar3->sarimax->res[d] + local_98;
    }
    psVar3->sigma2 = local_98 / (double)((psVar3->sarimax->Nused - iVar2) + 1);
    free((void *)rsum);
  }
  free(bxcx);
  free(__dest);
  return psVar3;
}

Assistant:

sarimax_wrapper_object sarimax_wrapper(sarimax_wrapper_object model,double *y, int N,int *order, int *seasonal, double *xreg, int r, int idrift,int mean,
	double *lambda, int biasadj,int method) {
	/*
	Init here. { sarimax_object,drift}
	*/
	sarimax_wrapper_object obj = NULL;
	int i, p,d,q,P,D,Q,s,ncoeff,drift,rr;
	double *x, *origx,*xreg2;
	double rsum;

	x = (double*) malloc(sizeof(double)*N);
	origx = (double*) malloc(sizeof(double)*N);
	obj = (sarimax_wrapper_object) malloc (sizeof(struct sarimax_wrapper_set));

	memcpy(x,y,sizeof(double)*N);
	memcpy(origx,y,sizeof(double)*N);

	if (lambda != NULL) boxcox_eval(y,N,*lambda,x);

	if (seasonal == NULL) {
		P = D = Q = s = 0;
	}


	if (model == NULL) {
		p = order[0];
		d = order[1];
		q = order[2];
		if (seasonal != NULL) {
			P = seasonal[0];
			D = seasonal[1];
			Q = seasonal[2];
			s = seasonal[3];
		}

		if (idrift == 1) {
			drift = 1;
		} else {
			drift = 0;
		}

		if (d + D > 1 && idrift == 1) {
			drift = 0;
		}

		//printf("drift %d \n",drift);

		rr = r;

		
		if (drift == 1) {
			obj->idrift = 1;
			rr++;
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			for(i = 0; i < N;++i) {
				xreg2[i] = (double) (i+1);
			}
			memcpy(xreg2+N,xreg,sizeof(double)*N*(rr-1));
		} else {
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			memcpy(xreg2,xreg,sizeof(double)*N*rr);
		}
		
		obj->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,mean,N);

		sarimax_exec(obj->sarimax,x,xreg2);
		obj->aic = obj->sarimax->aic;
		ncoeff = (obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q + obj->sarimax->M) + 1;
		obj->aicc = obj->aic + 2 * ncoeff * ((double)obj->sarimax->Nused / (double) (obj->sarimax->Nused - ncoeff - 1) - 1.0);
		obj->bic = obj->aic + ncoeff * (log((double)obj->sarimax->Nused) - 2.0);
		
		rsum = 0.0;

		for(i = 0; i < obj->sarimax->Nused;++i) {
			rsum += obj->sarimax->res[i]*obj->sarimax->res[i];
		}

		obj->sigma2 = rsum / (double) (obj->sarimax->Nused - ncoeff + 1);
		
		/// memory leak fix
		free(xreg2);

	}

	free(x);
	free(origx);

	return obj;
}